

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::BufferStorage::GetBufferParameterTest::iterate(GetBufferParameterTest *this)

{
  ostringstream *poVar1;
  GLenum flags;
  GLenum access;
  Context *pCVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  pointer ptVar7;
  ulong uVar8;
  char *description;
  bool bVar9;
  qpTestResult testResult;
  TestContext *this_00;
  ulong uVar10;
  MoveMapOwner MVar11;
  GLint queried_flags;
  GLint queried_access;
  GLint queried_size;
  GLint queried_immutable;
  Buffer buffer;
  MapOwner tmp;
  GLenum local_1e8;
  GLenum local_1e4;
  int local_1e0;
  int local_1dc;
  Buffer local_1d8;
  MapOwner local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar6;
  
  BufferStorage::Buffer::LoadExtDirectStateAccess((this->super_TestCase).m_context);
  pCVar2 = (this->super_TestCase).m_context;
  if (m_direct_state_access_support == 0) {
    this_00 = pCVar2->m_testCtx;
    description = "Unsupported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  else {
    iVar4 = (*pCVar2->m_renderCtx->_vptr_RenderContext[3])();
    lVar6 = CONCAT44(extraout_var,iVar4);
    ptVar7 = (this->m_test_cases).
             super__Vector_base<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_test_cases).
        super__Vector_base<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_finish != ptVar7) {
      bVar9 = true;
      uVar8 = 0;
      uVar10 = 1;
      do {
        flags = ptVar7[uVar8].m_flags;
        access = ptVar7[uVar8].m_access;
        local_1e8 = 0xffffffff;
        local_1dc = -1;
        local_1e0 = -1;
        local_1d8.m_context = (this->super_TestCase).m_context;
        local_1d8.m_id = 0xffffffff;
        local_1d8.m_target = 0x8892;
        BufferStorage::Buffer::InitStorage(&local_1d8,0x8892,flags,0x20,iterate::data);
        (**(code **)(lVar6 + 0x40))(0x8892,local_1d8.m_id);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"BindBuffer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                        ,0x284);
        if (*(code **)(lVar6 + 0x8f8) != (code *)0x0) {
          (**(code **)(lVar6 + 0x8f8))(local_1d8.m_id,0x8220,&local_1e8);
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"GetNameBufferParameteriv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                          ,0x2d1);
          (**(code **)(lVar6 + 0x8f8))(local_1d8.m_id,0x821f,&local_1dc);
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"GetNameBufferParameteriv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                          ,0x2d1);
          (**(code **)(lVar6 + 0x8f8))(local_1d8.m_id,0x8764,&local_1e0);
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"GetNameBufferParameteriv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                          ,0x2d1);
          if (local_1e8 != flags) {
            local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: "
                       ,0x4d);
            std::ostream::operator<<(poVar1,local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            bVar9 = false;
          }
        }
        if (local_1e8 != flags) {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: "
                     ,0x4d);
          std::ostream::operator<<(poVar1,local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          bVar9 = false;
        }
        if (local_1dc != 1) {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_IMMUTABLE_STORAGE: "
                     ,0x51);
          std::ostream::operator<<(poVar1,local_1dc);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
          std::ostream::operator<<(poVar1,1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          bVar9 = false;
        }
        if (local_1e0 != 0x20) {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_SIZE: ",0x44);
          std::ostream::operator<<(poVar1,local_1e0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
          std::ostream::_M_insert<long>((long)poVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          bVar9 = false;
        }
        local_1e8 = 0xffffffff;
        local_1dc = -1;
        local_1e0 = -1;
        (**(code **)(lVar6 + 0x7a8))(0x8892,0x8220,&local_1e8);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"GetBufferParameteriv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                        ,0x2de);
        (**(code **)(lVar6 + 0x7a8))(0x8892,0x821f,&local_1dc);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"GetBufferParameteriv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                        ,0x2de);
        (**(code **)(lVar6 + 0x7a8))(0x8892,0x8764,&local_1e0);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"GetBufferParameteriv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                        ,0x2de);
        if (local_1e8 != flags) {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "GetBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: ",0x48
                    );
          std::ostream::operator<<(poVar1,local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          bVar9 = false;
        }
        if (local_1dc != 1) {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "GetBufferParameteriv reported invalid state of GL_BUFFER_IMMUTABLE_STORAGE: ",
                     0x4c);
          std::ostream::operator<<(poVar1,local_1dc);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
          std::ostream::operator<<(poVar1,1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          bVar9 = false;
        }
        if (local_1e0 != 0x20) {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "GetBufferParameteriv reported invalid state of GL_BUFFER_SIZE: ",0x3f);
          std::ostream::operator<<(poVar1,local_1e0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
          std::ostream::_M_insert<long>((long)poVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          bVar9 = false;
        }
        if (access != 0) {
          local_1e4 = 0xffffffff;
          MVar11 = BufferStorage::Buffer::MapRange(&local_1d8,0,0x20,access);
          local_1c0.m_data = MVar11.data;
          local_1c0.m_buffer = MVar11.buffer;
          if (*(code **)(lVar6 + 0x8f8) != (code *)0x0) {
            (**(code **)(lVar6 + 0x8f8))(local_1d8.m_id,0x911f,&local_1e4);
            dVar5 = (**(code **)(lVar6 + 0x800))();
            glu::checkError(dVar5,"GetNameBufferParameteriv",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                            ,0x2d1);
            MVar11.data = local_1c0.m_data;
            MVar11.buffer = local_1c0.m_buffer;
          }
          local_1c0.m_data = MVar11.data;
          local_1c0.m_buffer = MVar11.buffer;
          if (local_1e4 != access) {
            local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_ACCESS_FLAGS: "
                       ,0x4c);
            std::ostream::operator<<(poVar1,local_1e4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            MVar11.data = local_1c0.m_data;
            MVar11.buffer = local_1c0.m_buffer;
            bVar9 = false;
          }
          local_1c0.m_data = MVar11.data;
          local_1c0.m_buffer = MVar11.buffer;
          local_1e4 = 0xffffffff;
          (**(code **)(lVar6 + 0x7a8))(0x8892,0x911f,&local_1e4);
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"GetBufferParameteriv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                          ,0x2de);
          if (local_1e4 != access) {
            local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "GetBufferParameteriv reported invalid state of GL_BUFFER_ACCESS_FLAGS: ",
                       0x47);
            std::ostream::operator<<(poVar1,local_1e4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            bVar9 = false;
          }
          BufferStorage::Buffer::MapOwner::~MapOwner(&local_1c0);
        }
        (**(code **)(lVar6 + 0x40))(0x8892,0);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"BindBuffer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                        ,0x284);
        BufferStorage::Buffer::~Buffer(&local_1d8);
        ptVar7 = (this->m_test_cases).
                 super__Vector_base<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar10 < (ulong)((long)(this->m_test_cases).
                                       super__Vector_base<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar7 >>
                                3);
        uVar8 = uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (bVar3);
      if (!bVar9) {
        this_00 = ((this->super_TestCase).m_context)->m_testCtx;
        description = "Fail";
        testResult = QP_TEST_RESULT_FAIL;
        goto LAB_00868349;
      }
    }
    this_00 = ((this->super_TestCase).m_context)->m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
LAB_00868349:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetBufferParameterTest::iterate()
{
	static const GLsizeiptr data_size = 32;
	static GLubyte			data[data_size];

	Buffer::LoadExtDirectStateAccess(m_context);

	// No GL45 or GL_ARB_direct_state_access support
	if (m_direct_state_access_support == FUNCTIONALITY_SUPPORT_NONE)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Unsupported");
		return tcu::TestNode::STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	for (GLuint i = 0; i < m_test_cases.size(); ++i)
	{
		const testCase& test_case = m_test_cases[i];
		const GLenum	access	= test_case.m_access;
		const GLenum	flags	 = test_case.m_flags;

		GLint queried_flags		= -1;
		GLint queried_immutable = -1;
		GLint queried_size		= -1;

		Buffer buffer(m_context);

		buffer.InitStorage(GL_ARRAY_BUFFER, flags, data_size, data);
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		if (0 != gl.getNamedBufferParameteriv)
		{
			Buffer::GetNamedParameter(gl, buffer.m_id, GL_BUFFER_STORAGE_FLAGS, &queried_flags);
			Buffer::GetNamedParameter(gl, buffer.m_id, GL_BUFFER_IMMUTABLE_STORAGE, &queried_immutable);
			Buffer::GetNamedParameter(gl, buffer.m_id, GL_BUFFER_SIZE, &queried_size);

			if (queried_flags != (GLint)flags)
			{
				test_result = false;
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: " << queried_flags
					<< " expected: " << flags << tcu::TestLog::EndMessage;
			}
		}

		if (queried_flags != (GLint)flags)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: " << queried_flags
				<< " expected: " << flags << tcu::TestLog::EndMessage;
		}

		if (queried_immutable != GL_TRUE)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_IMMUTABLE_STORAGE: "
				<< queried_immutable << " expected: " << GL_TRUE << tcu::TestLog::EndMessage;
		}

		if (queried_size != data_size)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_SIZE: " << queried_size
				<< " expected: " << data_size << tcu::TestLog::EndMessage;
		}

		queried_flags	 = -1;
		queried_immutable = -1;
		queried_size	  = -1;

		Buffer::GetParameter(gl, GL_ARRAY_BUFFER, GL_BUFFER_STORAGE_FLAGS, &queried_flags);
		Buffer::GetParameter(gl, GL_ARRAY_BUFFER, GL_BUFFER_IMMUTABLE_STORAGE, &queried_immutable);
		Buffer::GetParameter(gl, GL_ARRAY_BUFFER, GL_BUFFER_SIZE, &queried_size);

		if (queried_flags != (GLint)flags)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: " << queried_flags
				<< " expected: " << flags << tcu::TestLog::EndMessage;
		}

		if (queried_immutable != GL_TRUE)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetBufferParameteriv reported invalid state of GL_BUFFER_IMMUTABLE_STORAGE: " << queried_immutable
				<< " expected: " << GL_TRUE << tcu::TestLog::EndMessage;
		}

		if (queried_size != data_size)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetBufferParameteriv reported invalid state of GL_BUFFER_SIZE: " << queried_size
				<< " expected: " << data_size << tcu::TestLog::EndMessage;
		}

		if (0 != access)
		{
			GLint queried_access = -1;

			Buffer::MapOwner tmp(buffer.MapRange(0 /* offset */, data_size, access));

			if (0 != gl.getNamedBufferParameteriv)
			{
				Buffer::GetNamedParameter(gl, buffer.m_id, GL_BUFFER_ACCESS_FLAGS, &queried_access);
			}

			if (queried_access != (GLint)access)
			{
				test_result = false;
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_ACCESS_FLAGS: " << queried_access
					<< " expected: " << access << tcu::TestLog::EndMessage;
			}

			queried_access = -1;

			Buffer::GetParameter(gl, GL_ARRAY_BUFFER, GL_BUFFER_ACCESS_FLAGS, &queried_access);

			if (queried_access != (GLint)access)
			{
				test_result = false;
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GetBufferParameteriv reported invalid state of GL_BUFFER_ACCESS_FLAGS: " << queried_access
					<< " expected: " << access << tcu::TestLog::EndMessage;
			}
		}

		Buffer::Bind(gl, 0 /* id */, GL_ARRAY_BUFFER);
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}